

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeT2LoadImm12(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t RegNo;
  uint32_t uVar3;
  uint uVar4;
  DecodeStatus DVar5;
  uint imm;
  uint Rt;
  uint Rn;
  DecodeStatus S;
  void *Decoder_local;
  uint64_t Address_local;
  MCInst *pMStack_18;
  uint Insn_local;
  MCInst *Inst_local;
  
  Rt = 3;
  _Rn = Decoder;
  Decoder_local = (void *)Address;
  Address_local._4_4_ = Insn;
  pMStack_18 = Inst;
  uVar2 = fieldFromInstruction_4(Insn,0x10,4);
  RegNo = fieldFromInstruction_4(Address_local._4_4_,0xc,4);
  uVar3 = fieldFromInstruction_4(Address_local._4_4_,0,0xc);
  if (uVar2 == 0xf) {
    uVar4 = MCInst_getOpcode(pMStack_18);
    if (uVar4 == 0x945) {
      MCInst_setOpcode(pMStack_18,0x947);
    }
    else if (uVar4 == 0x954) {
      MCInst_setOpcode(pMStack_18,0x956);
    }
    else if (uVar4 == 0x95c) {
      MCInst_setOpcode(pMStack_18,0x95e);
    }
    else if (uVar4 == 0x964) {
      MCInst_setOpcode(pMStack_18,0x966);
    }
    else if (uVar4 == 0x96c) {
      MCInst_setOpcode(pMStack_18,0x96e);
    }
    else if (uVar4 == 0x9ad) {
      MCInst_setOpcode(pMStack_18,0x9af);
    }
    else {
      if (uVar4 != 0x9b1) {
        return MCDisassembler_Fail;
      }
      MCInst_setOpcode(pMStack_18,0x9b3);
    }
    Inst_local._4_4_ = DecodeT2LoadLabel(pMStack_18,Address_local._4_4_,(uint64_t)Decoder_local,_Rn)
    ;
  }
  else {
    if (RegNo == 0xf) {
      uVar4 = MCInst_getOpcode(pMStack_18);
      if (uVar4 == 0x954) {
        MCInst_setOpcode(pMStack_18,0x9ad);
      }
      else if (uVar4 == 0x964) {
        return MCDisassembler_Fail;
      }
    }
    uVar4 = MCInst_getOpcode(pMStack_18);
    if (((uVar4 != 0x9aa) && (uVar4 != 0x9ad)) && (uVar4 != 0x9b1)) {
      DVar5 = DecodeGPRRegisterClass(pMStack_18,RegNo,(uint64_t)Decoder_local,_Rn);
      _Var1 = Check(&Rt,DVar5);
      if (!_Var1) {
        return MCDisassembler_Fail;
      }
    }
    DVar5 = DecodeT2AddrModeImm12(pMStack_18,uVar2 << 0xd | uVar3,(uint64_t)Decoder_local,_Rn);
    _Var1 = Check(&Rt,DVar5);
    if (_Var1) {
      Inst_local._4_4_ = Rt;
    }
    else {
      Inst_local._4_4_ = MCDisassembler_Fail;
    }
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeT2LoadImm12(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void* Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned Rt = fieldFromInstruction_4(Insn, 12, 4);
	unsigned imm = fieldFromInstruction_4(Insn, 0, 12);
	imm |= (Rn << 13);

	if (Rn == 15) {
		switch (MCInst_getOpcode(Inst)) {
			case ARM_t2LDRi12:
				MCInst_setOpcode(Inst, ARM_t2LDRpci);
				break;
			case ARM_t2LDRHi12:
				MCInst_setOpcode(Inst, ARM_t2LDRHpci);
				break;
			case ARM_t2LDRSHi12:
				MCInst_setOpcode(Inst, ARM_t2LDRSHpci);
				break;
			case ARM_t2LDRBi12:
				MCInst_setOpcode(Inst, ARM_t2LDRBpci);
				break;
			case ARM_t2LDRSBi12:
				MCInst_setOpcode(Inst, ARM_t2LDRSBpci);
				break;
			case ARM_t2PLDi12:
				MCInst_setOpcode(Inst, ARM_t2PLDpci);
				break;
			case ARM_t2PLIi12:
				MCInst_setOpcode(Inst, ARM_t2PLIpci);
				break;
			default:
				return MCDisassembler_Fail;
		}
		return DecodeT2LoadLabel(Inst, Insn, Address, Decoder);
	}

	if (Rt == 15) {
		switch (MCInst_getOpcode(Inst)) {
			case ARM_t2LDRSHi12:
				return MCDisassembler_Fail;
			case ARM_t2LDRHi12:
				MCInst_setOpcode(Inst, ARM_t2PLDi12);
				break;
			default:
				break;
		}
	}

	switch (MCInst_getOpcode(Inst)) {
		case ARM_t2PLDi12:
		case ARM_t2PLDWi12:
		case ARM_t2PLIi12:
			break;
		default:
			if (!Check(&S, DecodeGPRRegisterClass(Inst, Rt, Address, Decoder)))
				return MCDisassembler_Fail;
	}

	if (!Check(&S, DecodeT2AddrModeImm12(Inst, imm, Address, Decoder)))
		return MCDisassembler_Fail;
	return S;
}